

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int str_byte(lua_State *L)

{
  int space;
  char *pcVar1;
  lua_Integer pos;
  size_t sVar2;
  size_t sVar3;
  uint local_48;
  int i;
  int n;
  size_t pose;
  size_t posi;
  lua_Integer pi;
  char *s;
  size_t l;
  lua_State *L_local;
  
  l = (size_t)L;
  pcVar1 = luaL_checklstring(L,1,(size_t *)&s);
  pos = luaL_optinteger((lua_State *)l,2,1);
  sVar2 = posrelatI(pos,(size_t)s);
  sVar3 = getendpos((lua_State *)l,3,pos,(size_t)s);
  if (sVar3 < sVar2) {
    L_local._4_4_ = 0;
  }
  else if (sVar3 - sVar2 < 0x7fffffff) {
    space = ((int)sVar3 - (int)sVar2) + 1;
    luaL_checkstack((lua_State *)l,space,"string slice too long");
    for (local_48 = 0; L_local._4_4_ = space, (int)local_48 < space; local_48 = local_48 + 1) {
      lua_pushinteger((lua_State *)l,(ulong)(byte)pcVar1[sVar2 + local_48 + -1]);
    }
  }
  else {
    L_local._4_4_ = luaL_error((lua_State *)l,"string slice too long");
  }
  return L_local._4_4_;
}

Assistant:

static int str_byte (lua_State *L) {
  size_t l;
  const char *s = luaL_checklstring(L, 1, &l);
  lua_Integer pi = luaL_optinteger(L, 2, 1);
  size_t posi = posrelatI(pi, l);
  size_t pose = getendpos(L, 3, pi, l);
  int n, i;
  if (posi > pose) return 0;  /* empty interval; return no values */
  if (l_unlikely(pose - posi >= (size_t)INT_MAX))  /* arithmetic overflow? */
    return luaL_error(L, "string slice too long");
  n = (int)(pose -  posi) + 1;
  luaL_checkstack(L, n, "string slice too long");
  for (i=0; i<n; i++)
    lua_pushinteger(L, cast_uchar(s[posi + cast_uint(i) - 1]));
  return n;
}